

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  undefined4 uVar5;
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [32];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  byte bVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined4 uVar27;
  undefined1 (*pauVar28) [16];
  uint uVar29;
  ulong uVar30;
  undefined1 (*pauVar31) [16];
  Scene *pSVar32;
  ulong uVar33;
  undefined1 (*pauVar34) [16];
  long lVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  AABBNodeMB4D *node1;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  undefined1 (*pauVar42) [16];
  ulong uVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [64];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  float fVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar110 [64];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2791;
  undefined1 local_2790 [16];
  undefined8 local_2780;
  float fStack_2778;
  float fStack_2774;
  Scene *local_2770;
  undefined8 uStack_2768;
  undefined1 local_2760 [16];
  size_t local_2748;
  RayHitK<4> *local_2740;
  long local_2738;
  undefined1 local_2730 [16];
  undefined1 local_2720 [16];
  undefined1 local_2710 [16];
  undefined1 local_2700 [16];
  undefined1 (*local_26f0) [16];
  long local_26e8;
  ulong local_26e0;
  ulong local_26d8;
  RTCFilterFunctionNArguments local_26d0;
  undefined1 local_26a0 [32];
  undefined1 local_2680 [16];
  undefined1 *local_2670;
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  undefined1 local_2640 [16];
  undefined1 local_2630 [16];
  undefined1 local_2620 [16];
  undefined1 local_2610 [16];
  undefined1 local_2600 [2] [16];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined1 local_2560 [16];
  RTCHitN local_2550 [16];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2520 [16];
  undefined4 local_2510;
  undefined4 uStack_250c;
  undefined4 uStack_2508;
  undefined4 uStack_2504;
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  uint local_24e0;
  uint uStack_24dc;
  uint uStack_24d8;
  uint uStack_24d4;
  uint uStack_24d0;
  uint uStack_24cc;
  uint uStack_24c8;
  uint uStack_24c4;
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  pauVar28 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar27 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_23c0._4_4_ = uVar27;
  local_23c0._0_4_ = uVar27;
  local_23c0._8_4_ = uVar27;
  local_23c0._12_4_ = uVar27;
  local_23c0._16_4_ = uVar27;
  local_23c0._20_4_ = uVar27;
  local_23c0._24_4_ = uVar27;
  local_23c0._28_4_ = uVar27;
  auVar91 = ZEXT3264(local_23c0);
  uVar27 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_23e0._4_4_ = uVar27;
  local_23e0._0_4_ = uVar27;
  local_23e0._8_4_ = uVar27;
  local_23e0._12_4_ = uVar27;
  local_23e0._16_4_ = uVar27;
  local_23e0._20_4_ = uVar27;
  local_23e0._24_4_ = uVar27;
  local_23e0._28_4_ = uVar27;
  auVar96 = ZEXT3264(local_23e0);
  uVar27 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2400._4_4_ = uVar27;
  local_2400._0_4_ = uVar27;
  local_2400._8_4_ = uVar27;
  local_2400._12_4_ = uVar27;
  local_2400._16_4_ = uVar27;
  local_2400._20_4_ = uVar27;
  local_2400._24_4_ = uVar27;
  local_2400._28_4_ = uVar27;
  auVar99 = ZEXT3264(local_2400);
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar19 = fVar1 * 0.99999964;
  local_2420._4_4_ = fVar19;
  local_2420._0_4_ = fVar19;
  local_2420._8_4_ = fVar19;
  local_2420._12_4_ = fVar19;
  local_2420._16_4_ = fVar19;
  local_2420._20_4_ = fVar19;
  local_2420._24_4_ = fVar19;
  local_2420._28_4_ = fVar19;
  auVar100 = ZEXT3264(local_2420);
  fVar19 = fVar2 * 0.99999964;
  local_2440._4_4_ = fVar19;
  local_2440._0_4_ = fVar19;
  local_2440._8_4_ = fVar19;
  local_2440._12_4_ = fVar19;
  local_2440._16_4_ = fVar19;
  local_2440._20_4_ = fVar19;
  local_2440._24_4_ = fVar19;
  local_2440._28_4_ = fVar19;
  auVar104 = ZEXT3264(local_2440);
  fVar19 = fVar3 * 0.99999964;
  local_2460._4_4_ = fVar19;
  local_2460._0_4_ = fVar19;
  local_2460._8_4_ = fVar19;
  local_2460._12_4_ = fVar19;
  local_2460._16_4_ = fVar19;
  local_2460._20_4_ = fVar19;
  local_2460._24_4_ = fVar19;
  local_2460._28_4_ = fVar19;
  auVar105 = ZEXT3264(local_2460);
  fVar1 = fVar1 * 1.0000004;
  local_2480._4_4_ = fVar1;
  local_2480._0_4_ = fVar1;
  local_2480._8_4_ = fVar1;
  local_2480._12_4_ = fVar1;
  local_2480._16_4_ = fVar1;
  local_2480._20_4_ = fVar1;
  local_2480._24_4_ = fVar1;
  local_2480._28_4_ = fVar1;
  auVar106 = ZEXT3264(local_2480);
  fVar2 = fVar2 * 1.0000004;
  local_24a0._4_4_ = fVar2;
  local_24a0._0_4_ = fVar2;
  local_24a0._8_4_ = fVar2;
  local_24a0._12_4_ = fVar2;
  local_24a0._16_4_ = fVar2;
  local_24a0._20_4_ = fVar2;
  local_24a0._24_4_ = fVar2;
  local_24a0._28_4_ = fVar2;
  auVar110 = ZEXT3264(local_24a0);
  fVar3 = fVar3 * 1.0000004;
  local_24c0._4_4_ = fVar3;
  local_24c0._0_4_ = fVar3;
  local_24c0._8_4_ = fVar3;
  local_24c0._12_4_ = fVar3;
  local_24c0._16_4_ = fVar3;
  local_24c0._20_4_ = fVar3;
  local_24c0._24_4_ = fVar3;
  local_24c0._28_4_ = fVar3;
  auVar116 = ZEXT3264(local_24c0);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_26d8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_26e0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar43 = local_26d8 ^ 0x20;
  iVar4 = (tray->tnear).field_0.i[k];
  local_25e0._4_4_ = iVar4;
  local_25e0._0_4_ = iVar4;
  local_25e0._8_4_ = iVar4;
  local_25e0._12_4_ = iVar4;
  local_25e0._16_4_ = iVar4;
  local_25e0._20_4_ = iVar4;
  local_25e0._24_4_ = iVar4;
  local_25e0._28_4_ = iVar4;
  auVar117 = ZEXT3264(local_25e0);
  uVar41 = local_26e0 ^ 0x20;
  iVar4 = (tray->tfar).field_0.i[k];
  auVar50 = ZEXT3264(CONCAT428(iVar4,CONCAT424(iVar4,CONCAT420(iVar4,CONCAT416(iVar4,CONCAT412(iVar4
                                                  ,CONCAT48(iVar4,CONCAT44(iVar4,iVar4))))))));
  local_26f0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_2740 = ray;
  local_2748 = k;
LAB_005cfc61:
  do {
    pauVar42 = pauVar28 + -1;
    pauVar28 = pauVar28 + -1;
    if (*(float *)(*pauVar42 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar33 = *(ulong *)*pauVar28;
      while ((uVar33 & 8) == 0) {
        uVar27 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar58._4_4_ = uVar27;
        auVar58._0_4_ = uVar27;
        auVar58._8_4_ = uVar27;
        auVar58._12_4_ = uVar27;
        auVar58._16_4_ = uVar27;
        auVar58._20_4_ = uVar27;
        auVar58._24_4_ = uVar27;
        auVar58._28_4_ = uVar27;
        uVar39 = uVar33 & 0xfffffffffffffff0;
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + uVar38),auVar58,
                                  *(undefined1 (*) [32])(uVar39 + 0x40 + uVar38));
        auVar90 = auVar91._0_32_;
        auVar20 = vsubps_avx(ZEXT1632(auVar51),auVar90);
        auVar21._4_4_ = auVar100._4_4_ * auVar20._4_4_;
        auVar21._0_4_ = auVar100._0_4_ * auVar20._0_4_;
        auVar21._8_4_ = auVar100._8_4_ * auVar20._8_4_;
        auVar21._12_4_ = auVar100._12_4_ * auVar20._12_4_;
        auVar21._16_4_ = auVar100._16_4_ * auVar20._16_4_;
        auVar21._20_4_ = auVar100._20_4_ * auVar20._20_4_;
        auVar21._24_4_ = auVar100._24_4_ * auVar20._24_4_;
        auVar21._28_4_ = auVar20._28_4_;
        auVar20 = vmaxps_avx(auVar117._0_32_,auVar21);
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + local_26d8),auVar58,
                                  *(undefined1 (*) [32])(uVar39 + 0x40 + local_26d8));
        auVar95 = auVar96._0_32_;
        auVar21 = vsubps_avx(ZEXT1632(auVar51),auVar95);
        auVar10._4_4_ = auVar104._4_4_ * auVar21._4_4_;
        auVar10._0_4_ = auVar104._0_4_ * auVar21._0_4_;
        auVar10._8_4_ = auVar104._8_4_ * auVar21._8_4_;
        auVar10._12_4_ = auVar104._12_4_ * auVar21._12_4_;
        auVar10._16_4_ = auVar104._16_4_ * auVar21._16_4_;
        auVar10._20_4_ = auVar104._20_4_ * auVar21._20_4_;
        auVar10._24_4_ = auVar104._24_4_ * auVar21._24_4_;
        auVar10._28_4_ = auVar21._28_4_;
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + local_26e0),auVar58,
                                  *(undefined1 (*) [32])(uVar39 + 0x40 + local_26e0));
        auVar98 = auVar99._0_32_;
        auVar21 = vsubps_avx(ZEXT1632(auVar51),auVar98);
        auVar23._4_4_ = auVar105._4_4_ * auVar21._4_4_;
        auVar23._0_4_ = auVar105._0_4_ * auVar21._0_4_;
        auVar23._8_4_ = auVar105._8_4_ * auVar21._8_4_;
        auVar23._12_4_ = auVar105._12_4_ * auVar21._12_4_;
        auVar23._16_4_ = auVar105._16_4_ * auVar21._16_4_;
        auVar23._20_4_ = auVar105._20_4_ * auVar21._20_4_;
        auVar23._24_4_ = auVar105._24_4_ * auVar21._24_4_;
        auVar23._28_4_ = auVar21._28_4_;
        auVar21 = vmaxps_avx(auVar10,auVar23);
        local_26a0 = vmaxps_avx(auVar20,auVar21);
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + (uVar38 ^ 0x20)),auVar58,
                                  *(undefined1 (*) [32])(uVar39 + 0x40 + (uVar38 ^ 0x20)));
        auVar20 = vsubps_avx(ZEXT1632(auVar51),auVar90);
        auVar24._4_4_ = auVar106._4_4_ * auVar20._4_4_;
        auVar24._0_4_ = auVar106._0_4_ * auVar20._0_4_;
        auVar24._8_4_ = auVar106._8_4_ * auVar20._8_4_;
        auVar24._12_4_ = auVar106._12_4_ * auVar20._12_4_;
        auVar24._16_4_ = auVar106._16_4_ * auVar20._16_4_;
        auVar24._20_4_ = auVar106._20_4_ * auVar20._20_4_;
        auVar24._24_4_ = auVar106._24_4_ * auVar20._24_4_;
        auVar24._28_4_ = auVar20._28_4_;
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + uVar43),auVar58,
                                  *(undefined1 (*) [32])(uVar39 + 0x40 + uVar43));
        auVar20 = vsubps_avx(ZEXT1632(auVar51),auVar95);
        auVar25._4_4_ = auVar110._4_4_ * auVar20._4_4_;
        auVar25._0_4_ = auVar110._0_4_ * auVar20._0_4_;
        auVar25._8_4_ = auVar110._8_4_ * auVar20._8_4_;
        auVar25._12_4_ = auVar110._12_4_ * auVar20._12_4_;
        auVar25._16_4_ = auVar110._16_4_ * auVar20._16_4_;
        auVar25._20_4_ = auVar110._20_4_ * auVar20._20_4_;
        auVar25._24_4_ = auVar110._24_4_ * auVar20._24_4_;
        auVar25._28_4_ = auVar20._28_4_;
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar39 + 0x100 + uVar41),auVar58,
                                  *(undefined1 (*) [32])(uVar39 + 0x40 + uVar41));
        auVar20 = vsubps_avx(ZEXT1632(auVar51),auVar98);
        auVar26._4_4_ = auVar116._4_4_ * auVar20._4_4_;
        auVar26._0_4_ = auVar116._0_4_ * auVar20._0_4_;
        auVar26._8_4_ = auVar116._8_4_ * auVar20._8_4_;
        auVar26._12_4_ = auVar116._12_4_ * auVar20._12_4_;
        auVar26._16_4_ = auVar116._16_4_ * auVar20._16_4_;
        auVar26._20_4_ = auVar116._20_4_ * auVar20._20_4_;
        auVar26._24_4_ = auVar116._24_4_ * auVar20._24_4_;
        auVar26._28_4_ = auVar20._28_4_;
        auVar20 = vminps_avx(auVar25,auVar26);
        auVar21 = vminps_avx(auVar50._0_32_,auVar24);
        auVar20 = vminps_avx(auVar21,auVar20);
        auVar20 = vcmpps_avx(local_26a0,auVar20,2);
        if (((uint)uVar33 & 7) == 6) {
          auVar21 = vcmpps_avx(*(undefined1 (*) [32])(uVar39 + 0x1c0),auVar58,2);
          auVar10 = vcmpps_avx(auVar58,*(undefined1 (*) [32])(uVar39 + 0x1e0),1);
          auVar21 = vandps_avx(auVar21,auVar10);
          auVar20 = vandps_avx(auVar21,auVar20);
          auVar51 = vpackssdw_avx(auVar20._0_16_,auVar20._16_16_);
        }
        else {
          auVar51 = vpackssdw_avx(auVar20._0_16_,auVar20._16_16_);
        }
        auVar51 = vpsllw_avx(auVar51,0xf);
        if ((((((((auVar51 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar51 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar51 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar51 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar51 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar51 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar51 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar51[0xf]
           ) {
          if (pauVar28 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          goto LAB_005cfc61;
        }
        auVar51 = vpacksswb_avx(auVar51,auVar51);
        bVar22 = SUB161(auVar51 >> 7,0) & 1 | (SUB161(auVar51 >> 0xf,0) & 1) << 1 |
                 (SUB161(auVar51 >> 0x17,0) & 1) << 2 | (SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                 (SUB161(auVar51 >> 0x27,0) & 1) << 4 | (SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                 (SUB161(auVar51 >> 0x37,0) & 1) << 6 | SUB161(auVar51 >> 0x3f,0) << 7;
        lVar37 = 0;
        for (uVar33 = (ulong)bVar22; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
          lVar37 = lVar37 + 1;
        }
        uVar33 = *(ulong *)(uVar39 + lVar37 * 8);
        uVar29 = bVar22 - 1 & (uint)bVar22;
        uVar30 = (ulong)uVar29;
        if (uVar29 != 0) {
          uVar6 = *(uint *)(local_26a0 + lVar37 * 4);
          lVar37 = 0;
          for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
            lVar37 = lVar37 + 1;
          }
          uVar29 = uVar29 - 1 & uVar29;
          uVar36 = (ulong)uVar29;
          uVar30 = *(ulong *)(uVar39 + lVar37 * 8);
          uVar7 = *(uint *)(local_26a0 + lVar37 * 4);
          if (uVar29 == 0) {
            if (uVar6 < uVar7) {
              *(ulong *)*pauVar28 = uVar30;
              *(uint *)(*pauVar28 + 8) = uVar7;
              pauVar28 = pauVar28 + 1;
            }
            else {
              *(ulong *)*pauVar28 = uVar33;
              *(uint *)(*pauVar28 + 8) = uVar6;
              pauVar28 = pauVar28 + 1;
              uVar33 = uVar30;
            }
          }
          else {
            auVar51._8_8_ = 0;
            auVar51._0_8_ = uVar33;
            auVar51 = vpunpcklqdq_avx(auVar51,ZEXT416(uVar6));
            auVar59._8_8_ = 0;
            auVar59._0_8_ = uVar30;
            auVar59 = vpunpcklqdq_avx(auVar59,ZEXT416(uVar7));
            lVar37 = 0;
            for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
              lVar37 = lVar37 + 1;
            }
            uVar29 = uVar29 - 1 & uVar29;
            uVar33 = (ulong)uVar29;
            auVar67._8_8_ = 0;
            auVar67._0_8_ = *(ulong *)(uVar39 + lVar37 * 8);
            auVar52 = vpunpcklqdq_avx(auVar67,ZEXT416(*(uint *)(local_26a0 + lVar37 * 4)));
            auVar67 = vpcmpgtd_avx(auVar59,auVar51);
            if (uVar29 == 0) {
              auVar80 = vpshufd_avx(auVar67,0xaa);
              auVar67 = vblendvps_avx(auVar59,auVar51,auVar80);
              auVar51 = vblendvps_avx(auVar51,auVar59,auVar80);
              auVar59 = vpcmpgtd_avx(auVar52,auVar67);
              auVar80 = vpshufd_avx(auVar59,0xaa);
              auVar59 = vblendvps_avx(auVar52,auVar67,auVar80);
              auVar67 = vblendvps_avx(auVar67,auVar52,auVar80);
              auVar52 = vpcmpgtd_avx(auVar67,auVar51);
              auVar80 = vpshufd_avx(auVar52,0xaa);
              auVar52 = vblendvps_avx(auVar67,auVar51,auVar80);
              auVar51 = vblendvps_avx(auVar51,auVar67,auVar80);
              *pauVar28 = auVar51;
              pauVar28[1] = auVar52;
              uVar33 = auVar59._0_8_;
              pauVar28 = pauVar28 + 2;
            }
            else {
              lVar37 = 0;
              for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
                lVar37 = lVar37 + 1;
              }
              uVar29 = uVar29 - 1 & uVar29;
              uVar30 = (ulong)uVar29;
              auVar80._8_8_ = 0;
              auVar80._0_8_ = *(ulong *)(uVar39 + lVar37 * 8);
              auVar80 = vpunpcklqdq_avx(auVar80,ZEXT416(*(uint *)(local_26a0 + lVar37 * 4)));
              if (uVar29 == 0) {
                auVar55 = vpshufd_avx(auVar67,0xaa);
                auVar67 = vblendvps_avx(auVar59,auVar51,auVar55);
                auVar51 = vblendvps_avx(auVar51,auVar59,auVar55);
                auVar59 = vpcmpgtd_avx(auVar80,auVar52);
                auVar55 = vpshufd_avx(auVar59,0xaa);
                auVar59 = vblendvps_avx(auVar80,auVar52,auVar55);
                auVar52 = vblendvps_avx(auVar52,auVar80,auVar55);
                auVar80 = vpcmpgtd_avx(auVar52,auVar51);
                auVar55 = vpshufd_avx(auVar80,0xaa);
                auVar80 = vblendvps_avx(auVar52,auVar51,auVar55);
                auVar51 = vblendvps_avx(auVar51,auVar52,auVar55);
                auVar52 = vpcmpgtd_avx(auVar59,auVar67);
                auVar55 = vpshufd_avx(auVar52,0xaa);
                auVar52 = vblendvps_avx(auVar59,auVar67,auVar55);
                auVar59 = vblendvps_avx(auVar67,auVar59,auVar55);
                auVar67 = vpcmpgtd_avx(auVar80,auVar59);
                auVar55 = vpshufd_avx(auVar67,0xaa);
                auVar67 = vblendvps_avx(auVar80,auVar59,auVar55);
                auVar59 = vblendvps_avx(auVar59,auVar80,auVar55);
                *pauVar28 = auVar51;
                pauVar28[1] = auVar59;
                pauVar28[2] = auVar67;
                uVar33 = auVar52._0_8_;
                pauVar42 = pauVar28 + 3;
              }
              else {
                *pauVar28 = auVar51;
                pauVar28[1] = auVar59;
                pauVar28[2] = auVar52;
                pauVar28[3] = auVar80;
                lVar37 = 0x30;
                do {
                  lVar40 = lVar37;
                  lVar37 = 0;
                  for (uVar33 = uVar30; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000
                      ) {
                    lVar37 = lVar37 + 1;
                  }
                  uVar33 = *(ulong *)(uVar39 + lVar37 * 8);
                  auVar52._8_8_ = 0;
                  auVar52._0_8_ = uVar33;
                  auVar51 = vpunpcklqdq_avx(auVar52,ZEXT416(*(uint *)(local_26a0 + lVar37 * 4)));
                  *(undefined1 (*) [16])(pauVar28[1] + lVar40) = auVar51;
                  uVar30 = uVar30 - 1 & uVar30;
                  lVar37 = lVar40 + 0x10;
                } while (uVar30 != 0);
                pauVar42 = (undefined1 (*) [16])(pauVar28[1] + lVar40);
                if (lVar40 + 0x10 != 0) {
                  lVar37 = 0x10;
                  pauVar31 = pauVar28;
                  do {
                    auVar51 = pauVar31[1];
                    pauVar31 = pauVar31 + 1;
                    uVar29 = vextractps_avx(auVar51,2);
                    lVar40 = lVar37;
                    do {
                      if (uVar29 <= *(uint *)(pauVar28[-1] + lVar40 + 8)) {
                        pauVar34 = (undefined1 (*) [16])(*pauVar28 + lVar40);
                        break;
                      }
                      *(undefined1 (*) [16])(*pauVar28 + lVar40) =
                           *(undefined1 (*) [16])(pauVar28[-1] + lVar40);
                      lVar40 = lVar40 + -0x10;
                      pauVar34 = pauVar28;
                    } while (lVar40 != 0);
                    *pauVar34 = auVar51;
                    lVar37 = lVar37 + 0x10;
                  } while (pauVar42 != pauVar31);
                  uVar33 = *(ulong *)*pauVar42;
                }
              }
              auVar91 = ZEXT3264(auVar90);
              auVar96 = ZEXT3264(auVar95);
              auVar99 = ZEXT3264(auVar98);
              auVar100 = ZEXT3264(auVar100._0_32_);
              auVar104 = ZEXT3264(auVar104._0_32_);
              auVar105 = ZEXT3264(auVar105._0_32_);
              auVar106 = ZEXT3264(auVar106._0_32_);
              auVar110 = ZEXT3264(auVar110._0_32_);
              auVar116 = ZEXT3264(auVar116._0_32_);
              auVar117 = ZEXT3264(local_25e0);
              pauVar28 = pauVar42;
            }
          }
        }
      }
      local_26e8 = (ulong)((uint)uVar33 & 0xf) - 8;
      if (local_26e8 != 0) {
        uVar33 = uVar33 & 0xfffffffffffffff0;
        lVar37 = 0;
        do {
          lVar40 = lVar37 * 0x140;
          uVar27 = *(undefined4 *)(ray + k * 4 + 0x70);
          auVar72._4_4_ = uVar27;
          auVar72._0_4_ = uVar27;
          auVar72._8_4_ = uVar27;
          auVar72._12_4_ = uVar27;
          auVar51 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x90 + lVar40),auVar72,
                                    *(undefined1 (*) [16])(uVar33 + lVar40));
          auVar59 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xa0 + lVar40),auVar72,
                                    *(undefined1 (*) [16])(uVar33 + 0x10 + lVar40));
          auVar52 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xb0 + lVar40),auVar72,
                                    *(undefined1 (*) [16])(uVar33 + 0x20 + lVar40));
          auVar80 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xc0 + lVar40),auVar72,
                                    *(undefined1 (*) [16])(uVar33 + 0x30 + lVar40));
          auVar55 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xd0 + lVar40),auVar72,
                                    *(undefined1 (*) [16])(uVar33 + 0x40 + lVar40));
          auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xe0 + lVar40),auVar72,
                                    *(undefined1 (*) [16])(uVar33 + 0x50 + lVar40));
          auVar61 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xf0 + lVar40),auVar72,
                                    *(undefined1 (*) [16])(uVar33 + 0x60 + lVar40));
          auVar74 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x100 + lVar40),auVar72,
                                    *(undefined1 (*) [16])(uVar33 + 0x70 + lVar40));
          auVar72 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x110 + lVar40),auVar72,
                                    *(undefined1 (*) [16])(uVar33 + 0x80 + lVar40));
          uVar27 = *(undefined4 *)(ray + k * 4);
          auVar73._4_4_ = uVar27;
          auVar73._0_4_ = uVar27;
          auVar73._8_4_ = uVar27;
          auVar73._12_4_ = uVar27;
          uVar27 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar108._4_4_ = uVar27;
          auVar108._0_4_ = uVar27;
          auVar108._8_4_ = uVar27;
          auVar108._12_4_ = uVar27;
          uVar27 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar114._4_4_ = uVar27;
          auVar114._0_4_ = uVar27;
          auVar114._8_4_ = uVar27;
          auVar114._12_4_ = uVar27;
          local_2710 = vsubps_avx(auVar51,auVar73);
          auVar67 = vsubps_avx(auVar59,auVar108);
          auVar51 = vsubps_avx(auVar52,auVar114);
          auVar59 = vsubps_avx(auVar80,auVar73);
          auVar52 = vsubps_avx(auVar55,auVar108);
          auVar80 = vsubps_avx(auVar54,auVar114);
          auVar55 = vsubps_avx(auVar61,auVar73);
          auVar54 = vsubps_avx(auVar74,auVar108);
          auVar61 = vsubps_avx(auVar72,auVar114);
          local_2560 = vsubps_avx(auVar55,local_2710);
          local_2580 = vsubps_avx(auVar54,auVar67);
          local_2570 = vsubps_avx(auVar61,auVar51);
          auVar44._0_4_ = auVar55._0_4_ + local_2710._0_4_;
          auVar44._4_4_ = auVar55._4_4_ + local_2710._4_4_;
          auVar44._8_4_ = auVar55._8_4_ + local_2710._8_4_;
          auVar44._12_4_ = auVar55._12_4_ + local_2710._12_4_;
          auVar68._0_4_ = auVar54._0_4_ + auVar67._0_4_;
          auVar68._4_4_ = auVar54._4_4_ + auVar67._4_4_;
          auVar68._8_4_ = auVar54._8_4_ + auVar67._8_4_;
          auVar68._12_4_ = auVar54._12_4_ + auVar67._12_4_;
          fVar1 = auVar51._0_4_;
          auVar74._0_4_ = auVar61._0_4_ + fVar1;
          fVar2 = auVar51._4_4_;
          auVar74._4_4_ = auVar61._4_4_ + fVar2;
          fVar3 = auVar51._8_4_;
          auVar74._8_4_ = auVar61._8_4_ + fVar3;
          fVar19 = auVar51._12_4_;
          auVar74._12_4_ = auVar61._12_4_ + fVar19;
          auVar109._0_4_ = auVar68._0_4_ * local_2570._0_4_;
          auVar109._4_4_ = auVar68._4_4_ * local_2570._4_4_;
          auVar109._8_4_ = auVar68._8_4_ * local_2570._8_4_;
          auVar109._12_4_ = auVar68._12_4_ * local_2570._12_4_;
          auVar72 = vfmsub231ps_fma(auVar109,local_2580,auVar74);
          auVar75._0_4_ = auVar74._0_4_ * local_2560._0_4_;
          auVar75._4_4_ = auVar74._4_4_ * local_2560._4_4_;
          auVar75._8_4_ = auVar74._8_4_ * local_2560._8_4_;
          auVar75._12_4_ = auVar74._12_4_ * local_2560._12_4_;
          auVar74 = vfmsub231ps_fma(auVar75,local_2570,auVar44);
          auVar45._0_4_ = local_2580._0_4_ * auVar44._0_4_;
          auVar45._4_4_ = local_2580._4_4_ * auVar44._4_4_;
          auVar45._8_4_ = local_2580._8_4_ * auVar44._8_4_;
          auVar45._12_4_ = local_2580._12_4_ * auVar44._12_4_;
          auVar44 = vfmsub231ps_fma(auVar45,local_2560,auVar68);
          local_2780._4_4_ = *(float *)(ray + k * 4 + 0x60);
          auVar97._0_4_ = local_2780._4_4_ * auVar44._0_4_;
          auVar97._4_4_ = local_2780._4_4_ * auVar44._4_4_;
          auVar97._8_4_ = local_2780._4_4_ * auVar44._8_4_;
          auVar97._12_4_ = local_2780._4_4_ * auVar44._12_4_;
          uVar27 = *(undefined4 *)(ray + k * 4 + 0x50);
          local_2790._4_4_ = uVar27;
          local_2790._0_4_ = uVar27;
          local_2790._8_4_ = uVar27;
          local_2790._12_4_ = uVar27;
          auVar74 = vfmadd231ps_fma(auVar97,local_2790,auVar74);
          uVar27 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar115._4_4_ = uVar27;
          auVar115._0_4_ = uVar27;
          auVar115._8_4_ = uVar27;
          auVar115._12_4_ = uVar27;
          local_25b0 = vfmadd231ps_fma(auVar74,auVar115,auVar72);
          local_2590 = vsubps_avx(auVar67,auVar52);
          local_25a0 = vsubps_avx(auVar51,auVar80);
          auVar69._0_4_ = auVar67._0_4_ + auVar52._0_4_;
          auVar69._4_4_ = auVar67._4_4_ + auVar52._4_4_;
          auVar69._8_4_ = auVar67._8_4_ + auVar52._8_4_;
          auVar69._12_4_ = auVar67._12_4_ + auVar52._12_4_;
          auVar76._0_4_ = fVar1 + auVar80._0_4_;
          auVar76._4_4_ = fVar2 + auVar80._4_4_;
          auVar76._8_4_ = fVar3 + auVar80._8_4_;
          auVar76._12_4_ = fVar19 + auVar80._12_4_;
          fVar11 = local_25a0._0_4_;
          auVar84._0_4_ = auVar69._0_4_ * fVar11;
          fVar13 = local_25a0._4_4_;
          auVar84._4_4_ = auVar69._4_4_ * fVar13;
          fVar15 = local_25a0._8_4_;
          auVar84._8_4_ = auVar69._8_4_ * fVar15;
          fVar17 = local_25a0._12_4_;
          auVar84._12_4_ = auVar69._12_4_ * fVar17;
          auVar72 = vfmsub231ps_fma(auVar84,local_2590,auVar76);
          auVar74 = vsubps_avx(local_2710,auVar59);
          fVar12 = auVar74._0_4_;
          auVar92._0_4_ = auVar76._0_4_ * fVar12;
          fVar14 = auVar74._4_4_;
          auVar92._4_4_ = auVar76._4_4_ * fVar14;
          fVar16 = auVar74._8_4_;
          auVar92._8_4_ = auVar76._8_4_ * fVar16;
          fVar18 = auVar74._12_4_;
          auVar92._12_4_ = auVar76._12_4_ * fVar18;
          auVar77._0_4_ = local_2710._0_4_ + auVar59._0_4_;
          auVar77._4_4_ = local_2710._4_4_ + auVar59._4_4_;
          auVar77._8_4_ = local_2710._8_4_ + auVar59._8_4_;
          auVar77._12_4_ = local_2710._12_4_ + auVar59._12_4_;
          auVar51 = vfmsub231ps_fma(auVar92,local_25a0,auVar77);
          fVar107 = local_2590._0_4_;
          auVar78._0_4_ = fVar107 * auVar77._0_4_;
          fVar111 = local_2590._4_4_;
          auVar78._4_4_ = fVar111 * auVar77._4_4_;
          fVar112 = local_2590._8_4_;
          auVar78._8_4_ = fVar112 * auVar77._8_4_;
          fVar113 = local_2590._12_4_;
          auVar78._12_4_ = fVar113 * auVar77._12_4_;
          auVar44 = vfmsub231ps_fma(auVar78,auVar74,auVar69);
          auVar79._0_4_ = local_2780._4_4_ * auVar44._0_4_;
          auVar79._4_4_ = local_2780._4_4_ * auVar44._4_4_;
          auVar79._8_4_ = local_2780._4_4_ * auVar44._8_4_;
          auVar79._12_4_ = local_2780._4_4_ * auVar44._12_4_;
          auVar51 = vfmadd231ps_fma(auVar79,local_2790,auVar51);
          local_26a0._16_16_ = vfmadd231ps_fma(auVar51,auVar115,auVar72);
          auVar72 = vsubps_avx(auVar59,auVar55);
          auVar60._0_4_ = auVar59._0_4_ + auVar55._0_4_;
          auVar60._4_4_ = auVar59._4_4_ + auVar55._4_4_;
          auVar60._8_4_ = auVar59._8_4_ + auVar55._8_4_;
          auVar60._12_4_ = auVar59._12_4_ + auVar55._12_4_;
          auVar55 = vsubps_avx(auVar52,auVar54);
          auVar53._0_4_ = auVar52._0_4_ + auVar54._0_4_;
          auVar53._4_4_ = auVar52._4_4_ + auVar54._4_4_;
          auVar53._8_4_ = auVar52._8_4_ + auVar54._8_4_;
          auVar53._12_4_ = auVar52._12_4_ + auVar54._12_4_;
          auVar52 = vsubps_avx(auVar80,auVar61);
          auVar81._0_4_ = auVar80._0_4_ + auVar61._0_4_;
          auVar81._4_4_ = auVar80._4_4_ + auVar61._4_4_;
          auVar81._8_4_ = auVar80._8_4_ + auVar61._8_4_;
          auVar81._12_4_ = auVar80._12_4_ + auVar61._12_4_;
          auVar85._0_4_ = auVar52._0_4_ * auVar53._0_4_;
          auVar85._4_4_ = auVar52._4_4_ * auVar53._4_4_;
          auVar85._8_4_ = auVar52._8_4_ * auVar53._8_4_;
          auVar85._12_4_ = auVar52._12_4_ * auVar53._12_4_;
          auVar59 = vfmsub231ps_fma(auVar85,auVar55,auVar81);
          auVar82._0_4_ = auVar81._0_4_ * auVar72._0_4_;
          auVar82._4_4_ = auVar81._4_4_ * auVar72._4_4_;
          auVar82._8_4_ = auVar81._8_4_ * auVar72._8_4_;
          auVar82._12_4_ = auVar81._12_4_ * auVar72._12_4_;
          auVar51 = vfmsub231ps_fma(auVar82,auVar52,auVar60);
          auVar61._0_4_ = auVar55._0_4_ * auVar60._0_4_;
          auVar61._4_4_ = auVar55._4_4_ * auVar60._4_4_;
          auVar61._8_4_ = auVar55._8_4_ * auVar60._8_4_;
          auVar61._12_4_ = auVar55._12_4_ * auVar60._12_4_;
          auVar80 = vfmsub231ps_fma(auVar61,auVar72,auVar53);
          local_2780._0_4_ = local_2780._4_4_;
          fStack_2778 = local_2780._4_4_;
          fStack_2774 = local_2780._4_4_;
          auVar62._0_4_ = local_2780._4_4_ * auVar80._0_4_;
          auVar62._4_4_ = local_2780._4_4_ * auVar80._4_4_;
          auVar62._8_4_ = local_2780._4_4_ * auVar80._8_4_;
          auVar62._12_4_ = local_2780._4_4_ * auVar80._12_4_;
          auVar51 = vfmadd231ps_fma(auVar62,local_2790,auVar51);
          auVar80 = vfmadd231ps_fma(auVar51,auVar115,auVar59);
          local_2680._0_4_ = auVar80._0_4_ + local_25b0._0_4_ + local_26a0._16_4_;
          local_2680._4_4_ = auVar80._4_4_ + local_25b0._4_4_ + local_26a0._20_4_;
          local_2680._8_4_ = auVar80._8_4_ + local_25b0._8_4_ + local_26a0._24_4_;
          local_2680._12_4_ = auVar80._12_4_ + local_25b0._12_4_ + local_26a0._28_4_;
          auVar54._8_4_ = 0x7fffffff;
          auVar54._0_8_ = 0x7fffffff7fffffff;
          auVar54._12_4_ = 0x7fffffff;
          auVar51 = vminps_avx(local_25b0,local_26a0._16_16_);
          auVar51 = vminps_avx(auVar51,auVar80);
          local_25c0 = vandps_avx(local_2680,auVar54);
          auVar93._0_4_ = local_25c0._0_4_ * 1.1920929e-07;
          auVar93._4_4_ = local_25c0._4_4_ * 1.1920929e-07;
          auVar93._8_4_ = local_25c0._8_4_ * 1.1920929e-07;
          auVar93._12_4_ = local_25c0._12_4_ * 1.1920929e-07;
          uVar39 = CONCAT44(auVar93._4_4_,auVar93._0_4_);
          auVar86._0_8_ = uVar39 ^ 0x8000000080000000;
          auVar86._8_4_ = -auVar93._8_4_;
          auVar86._12_4_ = -auVar93._12_4_;
          auVar51 = vcmpps_avx(auVar51,auVar86,5);
          auVar59 = vmaxps_avx(local_25b0,local_26a0._16_16_);
          auVar59 = vmaxps_avx(auVar59,auVar80);
          auVar59 = vcmpps_avx(auVar59,auVar93,2);
          auVar51 = vorps_avx(auVar51,auVar59);
          if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar51[0xf] < '\0') {
            auVar63._0_4_ = local_2570._0_4_ * fVar107;
            auVar63._4_4_ = local_2570._4_4_ * fVar111;
            auVar63._8_4_ = local_2570._8_4_ * fVar112;
            auVar63._12_4_ = local_2570._12_4_ * fVar113;
            auVar87._0_4_ = fVar12 * local_2580._0_4_;
            auVar87._4_4_ = fVar14 * local_2580._4_4_;
            auVar87._8_4_ = fVar16 * local_2580._8_4_;
            auVar87._12_4_ = fVar18 * local_2580._12_4_;
            auVar80 = vfmsub213ps_fma(local_2580,local_25a0,auVar63);
            auVar83._0_4_ = auVar55._0_4_ * fVar11;
            auVar83._4_4_ = auVar55._4_4_ * fVar13;
            auVar83._8_4_ = auVar55._8_4_ * fVar15;
            auVar83._12_4_ = auVar55._12_4_ * fVar17;
            auVar94._0_4_ = fVar12 * auVar52._0_4_;
            auVar94._4_4_ = fVar14 * auVar52._4_4_;
            auVar94._8_4_ = fVar16 * auVar52._8_4_;
            auVar94._12_4_ = fVar18 * auVar52._12_4_;
            auVar61 = vfmsub213ps_fma(auVar52,local_2590,auVar83);
            auVar59 = vandps_avx(auVar63,auVar54);
            auVar52 = vandps_avx(auVar83,auVar54);
            auVar59 = vcmpps_avx(auVar59,auVar52,1);
            local_2620 = vblendvps_avx(auVar61,auVar80,auVar59);
            auVar101._0_4_ = auVar72._0_4_ * fVar107;
            auVar101._4_4_ = auVar72._4_4_ * fVar111;
            auVar101._8_4_ = auVar72._8_4_ * fVar112;
            auVar101._12_4_ = auVar72._12_4_ * fVar113;
            auVar80 = vfmsub213ps_fma(auVar72,local_25a0,auVar94);
            auVar64._0_4_ = local_2560._0_4_ * fVar11;
            auVar64._4_4_ = local_2560._4_4_ * fVar13;
            auVar64._8_4_ = local_2560._8_4_ * fVar15;
            auVar64._12_4_ = local_2560._12_4_ * fVar17;
            auVar61 = vfmsub213ps_fma(local_2570,auVar74,auVar64);
            auVar59 = vandps_avx(auVar64,auVar54);
            auVar52 = vandps_avx(auVar94,auVar54);
            auVar59 = vcmpps_avx(auVar59,auVar52,1);
            local_2610 = vblendvps_avx(auVar80,auVar61,auVar59);
            auVar80 = vfmsub213ps_fma(local_2560,local_2590,auVar87);
            auVar55 = vfmsub213ps_fma(auVar55,auVar74,auVar101);
            auVar59 = vandps_avx(auVar87,auVar54);
            auVar52 = vandps_avx(auVar101,auVar54);
            auVar59 = vcmpps_avx(auVar59,auVar52,1);
            local_2600[0] = vblendvps_avx(auVar55,auVar80,auVar59);
            auVar55._0_4_ = local_2600[0]._0_4_ * local_2780._4_4_;
            auVar55._4_4_ = local_2600[0]._4_4_ * local_2780._4_4_;
            auVar55._8_4_ = local_2600[0]._8_4_ * local_2780._4_4_;
            auVar55._12_4_ = local_2600[0]._12_4_ * local_2780._4_4_;
            auVar59 = vfmadd213ps_fma(local_2790,local_2610,auVar55);
            auVar59 = vfmadd213ps_fma(auVar115,local_2620,auVar59);
            auVar56._0_4_ = auVar59._0_4_ + auVar59._0_4_;
            auVar56._4_4_ = auVar59._4_4_ + auVar59._4_4_;
            auVar56._8_4_ = auVar59._8_4_ + auVar59._8_4_;
            auVar56._12_4_ = auVar59._12_4_ + auVar59._12_4_;
            auVar88._0_4_ = local_2600[0]._0_4_ * fVar1;
            auVar88._4_4_ = local_2600[0]._4_4_ * fVar2;
            auVar88._8_4_ = local_2600[0]._8_4_ * fVar3;
            auVar88._12_4_ = local_2600[0]._12_4_ * fVar19;
            auVar59 = vfmadd213ps_fma(auVar67,local_2610,auVar88);
            auVar67 = vfmadd213ps_fma(local_2710,local_2620,auVar59);
            auVar59 = vrcpps_avx(auVar56);
            auVar102._8_4_ = 0x3f800000;
            auVar102._0_8_ = 0x3f8000003f800000;
            auVar102._12_4_ = 0x3f800000;
            auVar52 = vfnmadd213ps_fma(auVar59,auVar56,auVar102);
            auVar59 = vfmadd132ps_fma(auVar52,auVar59,auVar59);
            local_2630._0_4_ = auVar59._0_4_ * (auVar67._0_4_ + auVar67._0_4_);
            local_2630._4_4_ = auVar59._4_4_ * (auVar67._4_4_ + auVar67._4_4_);
            local_2630._8_4_ = auVar59._8_4_ * (auVar67._8_4_ + auVar67._8_4_);
            local_2630._12_4_ = auVar59._12_4_ * (auVar67._12_4_ + auVar67._12_4_);
            auVar91 = ZEXT1664(local_2630);
            uVar27 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar89._4_4_ = uVar27;
            auVar89._0_4_ = uVar27;
            auVar89._8_4_ = uVar27;
            auVar89._12_4_ = uVar27;
            auVar59 = vcmpps_avx(auVar89,local_2630,2);
            uVar27 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar103._4_4_ = uVar27;
            auVar103._0_4_ = uVar27;
            auVar103._8_4_ = uVar27;
            auVar103._12_4_ = uVar27;
            auVar96 = ZEXT1664(auVar103);
            auVar67 = vcmpps_avx(local_2630,auVar103,2);
            auVar59 = vandps_avx(auVar59,auVar67);
            auVar67 = auVar51 & auVar59;
            if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar67[0xf] < '\0') {
              auVar51 = vandps_avx(auVar51,auVar59);
              auVar59 = vcmpps_avx(auVar56,_DAT_01f7aa10,4);
              auVar67 = auVar59 & auVar51;
              if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar67[0xf] < '\0') {
                local_2760 = vandps_avx(auVar51,auVar59);
                local_26a0._0_16_ = local_25b0;
                local_2670 = &local_2791;
                local_2660 = local_2760;
                auVar51 = vrcpps_avx(local_2680);
                auVar70._8_4_ = 0x3f800000;
                auVar70._0_8_ = 0x3f8000003f800000;
                auVar70._12_4_ = 0x3f800000;
                auVar59 = vfnmadd213ps_fma(local_2680,auVar51,auVar70);
                auVar59 = vfmadd132ps_fma(auVar59,auVar51,auVar51);
                auVar65._8_4_ = 0x219392ef;
                auVar65._0_8_ = 0x219392ef219392ef;
                auVar65._12_4_ = 0x219392ef;
                auVar51 = vcmpps_avx(local_25c0,auVar65,5);
                auVar51 = vandps_avx(auVar59,auVar51);
                auVar46._0_4_ = local_25b0._0_4_ * auVar51._0_4_;
                auVar46._4_4_ = local_25b0._4_4_ * auVar51._4_4_;
                auVar46._8_4_ = local_25b0._8_4_ * auVar51._8_4_;
                auVar46._12_4_ = local_25b0._12_4_ * auVar51._12_4_;
                local_2650 = vminps_avx(auVar46,auVar70);
                auVar47._0_4_ = auVar51._0_4_ * local_26a0._16_4_;
                auVar47._4_4_ = auVar51._4_4_ * local_26a0._20_4_;
                auVar47._8_4_ = auVar51._8_4_ * local_26a0._24_4_;
                auVar47._12_4_ = auVar51._12_4_ * local_26a0._28_4_;
                local_2640 = vminps_avx(auVar47,auVar70);
                auVar66._8_4_ = 0x7f800000;
                auVar66._0_8_ = 0x7f8000007f800000;
                auVar66._12_4_ = 0x7f800000;
                auVar51 = vblendvps_avx(auVar66,local_2630,local_2760);
                auVar59 = vshufps_avx(auVar51,auVar51,0xb1);
                auVar59 = vminps_avx(auVar59,auVar51);
                auVar67 = vshufpd_avx(auVar59,auVar59,1);
                auVar59 = vminps_avx(auVar67,auVar59);
                auVar51 = vcmpps_avx(auVar51,auVar59,0);
                auVar67 = local_2760 & auVar51;
                auVar59 = vpcmpeqd_avx(auVar59,auVar59);
                if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar67[0xf] < '\0') {
                  auVar59 = auVar51;
                }
                lVar40 = lVar40 + uVar33;
                auVar51 = vandps_avx(local_2760,auVar59);
                uVar27 = vmovmskps_avx(auVar51);
                lVar35 = 0;
                for (uVar39 = CONCAT44((int)((ulong)context >> 0x20),uVar27); (uVar39 & 1) == 0;
                    uVar39 = uVar39 >> 1 | 0x8000000000000000) {
                  lVar35 = lVar35 + 1;
                }
                uStack_2768 = auVar115._8_8_;
                local_2770 = context->scene;
                pSVar32 = context->scene;
                do {
                  uVar29 = *(uint *)(lVar40 + 0x120 + lVar35 * 4);
                  uVar39 = (ulong)uVar29;
                  pGVar8 = (pSVar32->geometries).items[uVar39].ptr;
                  local_2790._0_8_ = pGVar8;
                  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    *(undefined4 *)(local_2760 + lVar35 * 4) = 0;
                  }
                  else {
                    local_2780 = lVar35;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      uVar27 = *(undefined4 *)(local_2650 + lVar35 * 4);
                      uVar5 = *(undefined4 *)(local_2640 + lVar35 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2630 + lVar35 * 4)
                      ;
                      *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2620 + lVar35 * 4)
                      ;
                      *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2610 + lVar35 * 4)
                      ;
                      *(undefined4 *)(ray + k * 4 + 0xe0) =
                           *(undefined4 *)(local_2600[0] + lVar35 * 4);
                      *(undefined4 *)(ray + k * 4 + 0xf0) = uVar27;
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar5;
                      *(undefined4 *)(ray + k * 4 + 0x110) =
                           *(undefined4 *)(lVar40 + 0x130 + lVar35 * 4);
                      *(uint *)(ray + k * 4 + 0x120) = uVar29;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      break;
                    }
                    uVar27 = *(undefined4 *)(local_2650 + lVar35 * 4);
                    local_2520._4_4_ = uVar27;
                    local_2520._0_4_ = uVar27;
                    local_2520._8_4_ = uVar27;
                    local_2520._12_4_ = uVar27;
                    local_2510 = *(undefined4 *)(local_2640 + lVar35 * 4);
                    local_24f0._4_4_ = uVar29;
                    local_24f0._0_4_ = uVar29;
                    local_24f0._8_4_ = uVar29;
                    local_24f0._12_4_ = uVar29;
                    uVar27 = *(undefined4 *)(lVar40 + 0x130 + lVar35 * 4);
                    auVar71._4_4_ = uVar27;
                    auVar71._0_4_ = uVar27;
                    auVar71._8_4_ = uVar27;
                    auVar71._12_4_ = uVar27;
                    uVar27 = *(undefined4 *)(local_2620 + lVar35 * 4);
                    uVar5 = *(undefined4 *)(local_2610 + lVar35 * 4);
                    local_2540._4_4_ = uVar5;
                    local_2540._0_4_ = uVar5;
                    local_2540._8_4_ = uVar5;
                    local_2540._12_4_ = uVar5;
                    uVar5 = *(undefined4 *)(local_2600[0] + lVar35 * 4);
                    local_2530._4_4_ = uVar5;
                    local_2530._0_4_ = uVar5;
                    local_2530._8_4_ = uVar5;
                    local_2530._12_4_ = uVar5;
                    local_2550[0] = (RTCHitN)(char)uVar27;
                    local_2550[1] = (RTCHitN)(char)((uint)uVar27 >> 8);
                    local_2550[2] = (RTCHitN)(char)((uint)uVar27 >> 0x10);
                    local_2550[3] = (RTCHitN)(char)((uint)uVar27 >> 0x18);
                    local_2550[4] = (RTCHitN)(char)uVar27;
                    local_2550[5] = (RTCHitN)(char)((uint)uVar27 >> 8);
                    local_2550[6] = (RTCHitN)(char)((uint)uVar27 >> 0x10);
                    local_2550[7] = (RTCHitN)(char)((uint)uVar27 >> 0x18);
                    local_2550[8] = (RTCHitN)(char)uVar27;
                    local_2550[9] = (RTCHitN)(char)((uint)uVar27 >> 8);
                    local_2550[10] = (RTCHitN)(char)((uint)uVar27 >> 0x10);
                    local_2550[0xb] = (RTCHitN)(char)((uint)uVar27 >> 0x18);
                    local_2550[0xc] = (RTCHitN)(char)uVar27;
                    local_2550[0xd] = (RTCHitN)(char)((uint)uVar27 >> 8);
                    local_2550[0xe] = (RTCHitN)(char)((uint)uVar27 >> 0x10);
                    local_2550[0xf] = (RTCHitN)(char)((uint)uVar27 >> 0x18);
                    uStack_250c = local_2510;
                    uStack_2508 = local_2510;
                    uStack_2504 = local_2510;
                    local_2500 = auVar71;
                    vpcmpeqd_avx2(ZEXT1632(local_2520),ZEXT1632(local_2520));
                    uStack_24dc = context->user->instID[0];
                    local_24e0 = uStack_24dc;
                    uStack_24d8 = uStack_24dc;
                    uStack_24d4 = uStack_24dc;
                    uStack_24d0 = context->user->instPrimID[0];
                    uStack_24cc = uStack_24d0;
                    uStack_24c8 = uStack_24d0;
                    uStack_24c4 = uStack_24d0;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2630 + lVar35 * 4);
                    local_2700 = *local_26f0;
                    local_26d0.valid = (int *)local_2700;
                    local_26d0.geometryUserPtr = pGVar8->userPtr;
                    local_26d0.context = context->user;
                    local_26d0.hit = local_2550;
                    local_26d0.N = 4;
                    local_2710._0_8_ = lVar40;
                    local_2720 = auVar91._0_16_;
                    local_2730 = auVar96._0_16_;
                    local_2738 = lVar37;
                    local_26d0.ray = (RTCRayN *)ray;
                    if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar8->intersectionFilterN)(&local_26d0);
                      auVar96 = ZEXT1664(local_2730);
                      auVar91 = ZEXT1664(local_2720);
                      k = local_2748;
                      ray = local_2740;
                      lVar40 = local_2710._0_8_;
                    }
                    if (local_2700 == (undefined1  [16])0x0) {
                      auVar51 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                      auVar51 = auVar51 ^ _DAT_01f7ae20;
                      lVar37 = local_2738;
                    }
                    else {
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_2790._0_8_ + 0x3e) & 0x40) != 0)))) {
                        (*p_Var9)(&local_26d0);
                        auVar96 = ZEXT1664(local_2730);
                        auVar91 = ZEXT1664(local_2720);
                        k = local_2748;
                        ray = local_2740;
                        lVar40 = local_2710._0_8_;
                      }
                      auVar59 = vpcmpeqd_avx(local_2700,_DAT_01f7aa10);
                      auVar67 = vpcmpeqd_avx(auVar71,auVar71);
                      auVar51 = auVar59 ^ auVar67;
                      lVar37 = local_2738;
                      if (local_2700 != (undefined1  [16])0x0) {
                        auVar59 = auVar59 ^ auVar67;
                        auVar67 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])local_26d0.hit);
                        *(undefined1 (*) [16])(local_26d0.ray + 0xc0) = auVar67;
                        auVar67 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])
                                                          (local_26d0.hit + 0x10));
                        *(undefined1 (*) [16])(local_26d0.ray + 0xd0) = auVar67;
                        auVar67 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])
                                                          (local_26d0.hit + 0x20));
                        *(undefined1 (*) [16])(local_26d0.ray + 0xe0) = auVar67;
                        auVar67 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])
                                                          (local_26d0.hit + 0x30));
                        *(undefined1 (*) [16])(local_26d0.ray + 0xf0) = auVar67;
                        auVar67 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])
                                                          (local_26d0.hit + 0x40));
                        *(undefined1 (*) [16])(local_26d0.ray + 0x100) = auVar67;
                        auVar67 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])
                                                          (local_26d0.hit + 0x50));
                        *(undefined1 (*) [16])(local_26d0.ray + 0x110) = auVar67;
                        auVar67 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])
                                                          (local_26d0.hit + 0x60));
                        *(undefined1 (*) [16])(local_26d0.ray + 0x120) = auVar67;
                        auVar67 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])
                                                          (local_26d0.hit + 0x70));
                        *(undefined1 (*) [16])(local_26d0.ray + 0x130) = auVar67;
                        auVar59 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])
                                                          (local_26d0.hit + 0x80));
                        *(undefined1 (*) [16])(local_26d0.ray + 0x140) = auVar59;
                      }
                    }
                    auVar48._8_8_ = 0x100000001;
                    auVar48._0_8_ = 0x100000001;
                    if ((auVar48 & auVar51) == (undefined1  [16])0x0) {
                      *(int *)(ray + k * 4 + 0x80) = auVar96._0_4_;
                    }
                    else {
                      auVar96 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                    }
                    *(undefined4 *)(local_2760 + local_2780 * 4) = 0;
                    uVar27 = auVar96._0_4_;
                    auVar49._4_4_ = uVar27;
                    auVar49._0_4_ = uVar27;
                    auVar49._8_4_ = uVar27;
                    auVar49._12_4_ = uVar27;
                    auVar51 = vcmpps_avx(auVar91._0_16_,auVar49,2);
                    local_2760 = vandps_avx(auVar51,local_2760);
                    uVar39 = local_2780;
                  }
                  if ((((local_2760 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_2760 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_2760 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_2760[0xf]) break;
                  auVar57._8_4_ = 0x7f800000;
                  auVar57._0_8_ = 0x7f8000007f800000;
                  auVar57._12_4_ = 0x7f800000;
                  auVar51 = vblendvps_avx(auVar57,auVar91._0_16_,local_2760);
                  auVar59 = vshufps_avx(auVar51,auVar51,0xb1);
                  auVar59 = vminps_avx(auVar59,auVar51);
                  auVar67 = vshufpd_avx(auVar59,auVar59,1);
                  auVar59 = vminps_avx(auVar67,auVar59);
                  auVar59 = vcmpps_avx(auVar51,auVar59,0);
                  auVar67 = local_2760 & auVar59;
                  auVar51 = local_2760;
                  if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar67[0xf] < '\0') {
                    auVar51 = vandps_avx(auVar59,local_2760);
                  }
                  uVar27 = vmovmskps_avx(auVar51);
                  lVar35 = 0;
                  for (uVar39 = CONCAT44((int)(uVar39 >> 0x20),uVar27); pSVar32 = local_2770,
                      (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
                    lVar35 = lVar35 + 1;
                  }
                } while( true );
              }
            }
          }
          lVar37 = lVar37 + 1;
        } while (lVar37 != local_26e8);
      }
      uVar27 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar50 = ZEXT3264(CONCAT428(uVar27,CONCAT424(uVar27,CONCAT420(uVar27,CONCAT416(uVar27,
                                                  CONCAT412(uVar27,CONCAT48(uVar27,CONCAT44(uVar27,
                                                  uVar27))))))));
      auVar91 = ZEXT3264(local_23c0);
      auVar96 = ZEXT3264(local_23e0);
      auVar99 = ZEXT3264(local_2400);
      auVar100 = ZEXT3264(local_2420);
      auVar104 = ZEXT3264(local_2440);
      auVar105 = ZEXT3264(local_2460);
      auVar106 = ZEXT3264(local_2480);
      auVar110 = ZEXT3264(local_24a0);
      auVar116 = ZEXT3264(local_24c0);
      auVar117 = ZEXT3264(local_25e0);
    }
    if (pauVar28 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }